

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

int p2sc_string_isnumeric(char *s)

{
  int *piVar1;
  char *in_RDI;
  double d;
  char *end;
  char *local_18 [3];
  
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    return 0;
  }
  local_18[0] = (char *)0x0;
  g_ascii_strtod(in_RDI,local_18);
  piVar1 = __errno_location();
  if (((*piVar1 == 0) || (piVar1 = __errno_location(), *piVar1 == 0x22)) &&
     ((local_18[0] == (char *)0x0 || (*local_18[0] == '\0')))) {
    return 1;
  }
  return 0;
}

Assistant:

int p2sc_string_isnumeric(const char *s) {
    if (!s || !*s)
        return 0;

    char *end = NULL;
    double d __attribute__((unused)) = g_ascii_strtod(s, &end);
    if ((!errno || errno == ERANGE) && (!end || !*end))
        return 1;

    return 0;
}